

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstanceSymbols.cpp
# Opt level: O0

void slang::ast::PrimitiveInstanceSymbol::fromSyntax
               (PrimitiveInstantiationSyntax *syntax,ASTContext *context,
               SmallVectorBase<const_slang::ast::Symbol_*> *results,
               SmallVectorBase<const_slang::ast::Symbol_*> *implicitNets)

{
  SourceRange sourceRange;
  bool bVar1;
  Compilation *this;
  InstanceBodySymbol *pIVar2;
  iterator ppVar3;
  Scope *this_00;
  SourceLocation this_01;
  long in_RDI;
  string_view sVar4;
  string_view sVar5;
  DefinitionLookupResult defResult;
  type *instSyntax;
  type *defResult_1;
  iterator __end4;
  iterator __begin4;
  ResolvedInstanceRules *__range4;
  ResolvedInstanceRules instanceRules;
  InstanceBodySymbol *parentInst;
  anon_class_48_6_08dfe5ab createPrims;
  PrimitiveSymbol *prim;
  string_view name;
  Compilation *comp;
  SmallSet<std::basic_string_view<char,_std::char_traits<char>_>,_8UL,_slang::detail::hashing::StackAllocator<std::basic_string_view<char,_std::char_traits<char>_>,_128UL,_16UL>_>
  implicitNetNames;
  ResolvedInstanceRules *in_stack_00000580;
  Scope *in_stack_fffffffffffffd58;
  Token *in_stack_fffffffffffffd60;
  SourceLocation in_stack_fffffffffffffdd8;
  iterator local_1f0;
  SmallVectorBase<const_slang::ast::Symbol_*> *in_stack_fffffffffffffe58;
  SmallVectorBase<const_slang::ast::Symbol_*> *in_stack_fffffffffffffe60;
  ASTContext *in_stack_fffffffffffffe68;
  HierarchicalInstanceSyntax *in_stack_fffffffffffffe70;
  PrimitiveInstantiationSyntax *in_stack_fffffffffffffe78;
  PrimitiveSymbol *in_stack_fffffffffffffe80;
  SmallSet<std::basic_string_view<char,_std::char_traits<char>_>,_8UL,_slang::detail::hashing::StackAllocator<std::basic_string_view<char,_std::char_traits<char>_>,_128UL,_16UL>_>
  *in_stack_fffffffffffffe90;
  
  SmallSet<std::basic_string_view<char,_std::char_traits<char>_>,_8UL,_slang::detail::hashing::StackAllocator<std::basic_string_view<char,_std::char_traits<char>_>,_128UL,_16UL>_>
  ::SmallSet((SmallSet<std::basic_string_view<char,_std::char_traits<char>_>,_8UL,_slang::detail::hashing::StackAllocator<std::basic_string_view<char,_std::char_traits<char>_>,_128UL,_16UL>_>
              *)in_stack_fffffffffffffd60);
  this = ASTContext::getCompilation((ASTContext *)0x6eaac1);
  sVar4 = parsing::Token::valueText(in_stack_fffffffffffffd60);
  this_01 = (SourceLocation)sVar4._M_str;
  if (*(short *)(in_RDI + 0x50) == 2) {
    not_null<const_slang::ast::Scope_*>::operator->((not_null<const_slang::ast::Scope_*> *)0x6eac3b)
    ;
    pIVar2 = Scope::getContainingInstance(in_stack_fffffffffffffd58);
    if (((pIVar2 != (InstanceBodySymbol *)0x0) && (pIVar2->parentInstance != (InstanceSymbol *)0x0))
       && (pIVar2->parentInstance->resolvedConfig != (ResolvedConfig *)0x0)) {
      SmallVector<std::pair<slang::ast::Compilation::DefinitionLookupResult,_const_slang::syntax::HierarchicalInstanceSyntax_*>,_2UL>
      ::SmallVector((SmallVector<std::pair<slang::ast::Compilation::DefinitionLookupResult,_const_slang::syntax::HierarchicalInstanceSyntax_*>,_2UL>
                     *)0x6eacab);
      anon_unknown.dwarf_f4258f::
      resolveInstanceOverrides<slang::syntax::PrimitiveInstantiationSyntax>
                ((ResolvedConfig *)implicitNetNames.super_Storage._136_8_,
                 (ASTContext *)implicitNetNames.super_Storage.ptr,
                 (PrimitiveInstantiationSyntax *)implicitNetNames.super_Storage.buffer._120_8_,
                 (string_view)implicitNetNames._152_16_,(DiagCode)implicitNetNames._148_4_,
                 in_stack_00000580);
      bVar1 = SmallVectorBase<std::pair<slang::ast::Compilation::DefinitionLookupResult,_const_slang::syntax::HierarchicalInstanceSyntax_*>_>
              ::empty((SmallVectorBase<std::pair<slang::ast::Compilation::DefinitionLookupResult,_const_slang::syntax::HierarchicalInstanceSyntax_*>_>
                       *)&stack0xfffffffffffffe40);
      if (bVar1) {
        bVar1 = false;
      }
      else {
        local_1f0 = SmallVectorBase<std::pair<slang::ast::Compilation::DefinitionLookupResult,_const_slang::syntax::HierarchicalInstanceSyntax_*>_>
                    ::begin((SmallVectorBase<std::pair<slang::ast::Compilation::DefinitionLookupResult,_const_slang::syntax::HierarchicalInstanceSyntax_*>_>
                             *)&stack0xfffffffffffffe40);
        ppVar3 = SmallVectorBase<std::pair<slang::ast::Compilation::DefinitionLookupResult,_const_slang::syntax::HierarchicalInstanceSyntax_*>_>
                 ::end((SmallVectorBase<std::pair<slang::ast::Compilation::DefinitionLookupResult,_const_slang::syntax::HierarchicalInstanceSyntax_*>_>
                        *)&stack0xfffffffffffffe40);
        for (; local_1f0 != ppVar3; local_1f0 = local_1f0 + 1) {
          std::
          get<0ul,slang::ast::Compilation::DefinitionLookupResult,slang::syntax::HierarchicalInstanceSyntax_const*>
                    ((pair<slang::ast::Compilation::DefinitionLookupResult,_const_slang::syntax::HierarchicalInstanceSyntax_*>
                      *)0x6ead92);
          std::
          get<1ul,slang::ast::Compilation::DefinitionLookupResult,slang::syntax::HierarchicalInstanceSyntax_const*>
                    ((pair<slang::ast::Compilation::DefinitionLookupResult,_const_slang::syntax::HierarchicalInstanceSyntax_*>
                      *)0x6eada7);
          fromSyntax::anon_class_48_6_08dfe5ab::operator()
                    ((anon_class_48_6_08dfe5ab *)defResult_1,(DefinitionLookupResult *)instSyntax,
                     (HierarchicalInstanceSyntax *)defResult.configRule);
        }
        bVar1 = true;
      }
      SmallVector<std::pair<slang::ast::Compilation::DefinitionLookupResult,_const_slang::syntax::HierarchicalInstanceSyntax_*>,_2UL>
      ::~SmallVector((SmallVector<std::pair<slang::ast::Compilation::DefinitionLookupResult,_const_slang::syntax::HierarchicalInstanceSyntax_*>,_2UL>
                      *)0x6eae37);
      if (bVar1) goto LAB_006eaf13;
    }
    this_00 = not_null<const_slang::ast::Scope_*>::operator*
                        ((not_null<const_slang::ast::Scope_*> *)0x6eae74);
    sVar5 = (string_view)parsing::Token::range((Token *)this_00);
    sourceRange.endLoc = in_stack_fffffffffffffdd8;
    sourceRange.startLoc = this_01;
    Compilation::getDefinition(this,sVar5,(Scope *)sVar4._M_len,sourceRange,(DiagCode)0xd10006);
    fromSyntax::anon_class_48_6_08dfe5ab::operator()
              ((anon_class_48_6_08dfe5ab *)defResult_1,(DefinitionLookupResult *)instSyntax,
               (HierarchicalInstanceSyntax *)defResult.configRule);
  }
  else {
    sVar5._M_str = (char *)this;
    sVar5._M_len = sVar4._M_len;
    Compilation::getGateType((Compilation *)this_01,sVar5);
    anon_unknown_292::createPrimitives<slang::syntax::PrimitiveInstantiationSyntax>
              (in_stack_fffffffffffffe80,in_stack_fffffffffffffe78,in_stack_fffffffffffffe70,
               in_stack_fffffffffffffe68,in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,
               in_stack_fffffffffffffe90);
  }
LAB_006eaf13:
  SmallSet<std::basic_string_view<char,_std::char_traits<char>_>,_8UL,_slang::detail::hashing::StackAllocator<std::basic_string_view<char,_std::char_traits<char>_>,_128UL,_16UL>_>
  ::~SmallSet((SmallSet<std::basic_string_view<char,_std::char_traits<char>_>,_8UL,_slang::detail::hashing::StackAllocator<std::basic_string_view<char,_std::char_traits<char>_>,_128UL,_16UL>_>
               *)0x6eaf20);
  return;
}

Assistant:

void PrimitiveInstanceSymbol::fromSyntax(const PrimitiveInstantiationSyntax& syntax,
                                         const ASTContext& context,
                                         SmallVectorBase<const Symbol*>& results,
                                         SmallVectorBase<const Symbol*>& implicitNets) {
    SmallSet<std::string_view, 8> implicitNetNames;
    auto& comp = context.getCompilation();
    auto name = syntax.type.valueText();

    // If the type is not an identifier then it should be a gate keyword.
    if (syntax.type.kind != TokenKind::Identifier) {
        auto prim = comp.getGateType(name);
        SLANG_ASSERT(prim);
        createPrimitives(*prim, syntax, nullptr, context, results, implicitNets, implicitNetNames);
        return;
    }

    auto createPrims = [&](const Compilation::DefinitionLookupResult& defResult,
                           const HierarchicalInstanceSyntax* specificInstance) {
        if (defResult.configRule)
            defResult.configRule->isUsed = true;

        auto def = defResult.definition;
        if (def) {
            if (def->kind == SymbolKind::Primitive) {
                createPrimitives(def->as<PrimitiveSymbol>(), syntax, specificInstance, context,
                                 results, implicitNets, implicitNetNames);
                return;
            }

            SLANG_ASSERT(syntax.strength || syntax.delay);
            if (syntax.strength) {
                auto& diag = context.addDiag(diag::InstanceWithStrength,
                                             syntax.strength->sourceRange());
                diag << def->name;
                if (specificInstance)
                    diag << specificInstance->sourceRange();
            }
            else if (comp.hasFlag(CompilationFlags::AllowBareValParamAssignment) &&
                     syntax.delay->kind == SyntaxKind::DelayControl) {
                // We're allowing this to be a hierarchical instantiation with a single param
                // assignment, and just pretending the parentheses were provided.
                auto& delaySyntax = syntax.delay->as<DelaySyntax>();
                auto& delayVal = *delaySyntax.delayValue;

                SmallVector<TokenOrSyntax> parameters;
                parameters.push_back(comp.emplace<OrderedParamAssignmentSyntax>(delayVal));

                auto missing = [&](TokenKind tk, SourceLocation loc) {
                    return Token::createMissing(comp, tk, loc);
                };

                auto pvas = comp.emplace<ParameterValueAssignmentSyntax>(
                    delaySyntax.hash,
                    missing(TokenKind::OpenParenthesis, delayVal.getFirstToken().location()),
                    parameters.copy(comp),
                    missing(TokenKind::CloseParenthesis, delayVal.getLastToken().location()));

                // Rebuild the instance list. The const_casts are fine because
                // we're going to immediately treat them as const again below.
                SmallVector<TokenOrSyntax> instanceBuf;
                if (specificInstance) {
                    instanceBuf.push_back(
                        const_cast<HierarchicalInstanceSyntax*>(specificInstance));
                }
                else {
                    for (auto inst : syntax.instances)
                        instanceBuf.push_back(const_cast<HierarchicalInstanceSyntax*>(inst));
                }

                auto instantiation = comp.emplace<HierarchyInstantiationSyntax>(
                    syntax.attributes, syntax.type, pvas, instanceBuf.copy(comp), syntax.semi);
                InstanceSymbol::fromSyntax(comp, *instantiation, context, results, implicitNets);
                return;
            }
            else {
                auto& diag = context.addDiag(diag::InstanceWithDelay,
                                             syntax.delay->getFirstToken().location() + 1);
                if (specificInstance)
                    diag << specificInstance->sourceRange();
            }
        }
        UninstantiatedDefSymbol::fromSyntax(comp, syntax, specificInstance, context, results,
                                            implicitNets, implicitNetNames);
    };

    // Check if there are configuration instance override paths to check.
    auto parentInst = context.scope->getContainingInstance();
    if (parentInst && parentInst->parentInstance && parentInst->parentInstance->resolvedConfig) {
        ResolvedInstanceRules instanceRules;
        resolveInstanceOverrides(*parentInst->parentInstance->resolvedConfig, context, syntax, name,
                                 diag::UnknownPrimitive, instanceRules);
        if (!instanceRules.empty()) {
            for (auto& [defResult, instSyntax] : instanceRules)
                createPrims(defResult, instSyntax);
            return;
        }
    }

    // Simple case; just create the primitive instances.
    auto defResult = comp.getDefinition(name, *context.scope, syntax.type.range(),
                                        diag::UnknownPrimitive);
    createPrims(defResult, nullptr);
}